

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::bt_peer_connection::on_hashes(bt_peer_connection *this,int received)

{
  _Atomic_word *p_Var1;
  crypto_receive_buffer *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *this_01;
  hash_request *phVar3;
  pointer phVar4;
  int iVar5;
  int iVar6;
  undefined4 extraout_var;
  char *pcVar7;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> iVar8;
  char *pcVar9;
  __normal_iterator<libtorrent::aux::hash_request_*,_std::vector<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>_>
  _Var10;
  pointer phVar11;
  file_index_t index;
  torrent *this_02;
  ulong uVar12;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> sVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_03;
  uint blocks;
  uint uVar14;
  int iVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  span<const_char> sVar19;
  span<libtorrent::digest32<256L>_> hashes_00;
  char *ptr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_> hashes;
  char cStack_b0;
  char cStack_af;
  char cStack_ae;
  char cStack_ad;
  char cStack_ac;
  char cStack_ab;
  char cStack_aa;
  char cStack_a9;
  hash_request hr;
  sha256_hash file_root;
  error_code local_40;
  
  peer_connection::received_bytes(&this->super_peer_connection,0,received);
  iVar5 = (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[7])(this);
  if ((*(byte *)(CONCAT44(extraout_var,iVar5) + 0x1f) & 1) == 0) {
    file_root.m_number._M_elems._0_16_ = errors::make_error_code(invalid_message);
    (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
              (this,&file_root,1,2);
  }
  else {
    this_02 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
              super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (this->super_peer_connection).super_peer_connection_hot_members.m_torrent.
             super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
    this_03 = p_Var2;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_weak_count = p_Var2->_M_weak_count + 1;
      }
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        iVar5 = p_Var2->_M_use_count;
        do {
          this_03 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          if (iVar5 == 0) break;
          LOCK();
          iVar6 = p_Var2->_M_use_count;
          bVar16 = iVar5 == iVar6;
          if (bVar16) {
            p_Var2->_M_use_count = iVar5 + 1;
            iVar6 = iVar5;
          }
          iVar5 = iVar6;
          UNLOCK();
          this_03 = p_Var2;
        } while (!bVar16);
      }
    }
    if (this_03 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      this_02 = (torrent *)0x0;
    }
    else if (this_03->_M_use_count == 0) {
      this_02 = (torrent *)0x0;
    }
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = &p_Var2->_M_weak_count;
        iVar5 = *p_Var1;
        *p_Var1 = *p_Var1 + -1;
        UNLOCK();
      }
      else {
        iVar5 = p_Var2->_M_weak_count;
        p_Var2->_M_weak_count = iVar5 + -1;
      }
      if (iVar5 == 1) {
        (*p_Var2->_vptr__Sp_counted_base[3])();
      }
    }
    this_01 = (this_02->super_torrent_hot_members).m_torrent_file.
              super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    this_00 = &this->m_recv_buffer;
    sVar19 = crypto_receive_buffer::get(this_00);
    pcVar7 = sVar19.m_ptr;
    if (0x30 < sVar19.m_len) {
      ptr = pcVar7 + 1;
      file_root.m_number._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar7 + 1);
      file_root.m_number._M_elems._16_8_ = *(undefined8 *)(pcVar7 + 0x11);
      file_root.m_number._M_elems._24_8_ = *(undefined8 *)(pcVar7 + 0x19);
      local_d0 = this_03;
      iVar8 = file_storage::file_range(&this_01->m_files);
      uVar12 = 0xffffffff;
      hr.file.m_val = -1;
      sVar13 = iVar8._end.m_val;
      if (iVar8._begin.m_val.m_val != sVar13.m_val) {
        do {
          index.m_val = (int)iVar8._begin.m_val;
          file_storage::root((sha256_hash *)&hashes,&this_01->m_files,index);
          auVar17[0] = -((char)hashes.
                               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage ==
                        (char)file_root.m_number._M_elems[4]);
          auVar17[1] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._1_1_ ==
                        file_root.m_number._M_elems[4]._1_1_);
          auVar17[2] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ ==
                        file_root.m_number._M_elems[4]._2_1_);
          auVar17[3] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._3_1_ ==
                        file_root.m_number._M_elems[4]._3_1_);
          auVar17[4] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ ==
                        (char)file_root.m_number._M_elems[5]);
          auVar17[5] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._5_1_ ==
                        file_root.m_number._M_elems[5]._1_1_);
          auVar17[6] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ ==
                        file_root.m_number._M_elems[5]._2_1_);
          auVar17[7] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ ==
                        file_root.m_number._M_elems[5]._3_1_);
          auVar17[8] = -(cStack_b0 == (char)file_root.m_number._M_elems[6]);
          auVar17[9] = -(cStack_af == file_root.m_number._M_elems[6]._1_1_);
          auVar17[10] = -(cStack_ae == file_root.m_number._M_elems[6]._2_1_);
          auVar17[0xb] = -(cStack_ad == file_root.m_number._M_elems[6]._3_1_);
          auVar17[0xc] = -(cStack_ac == (char)file_root.m_number._M_elems[7]);
          auVar17[0xd] = -(cStack_ab == file_root.m_number._M_elems[7]._1_1_);
          auVar17[0xe] = -(cStack_aa == file_root.m_number._M_elems[7]._2_1_);
          auVar17[0xf] = -(cStack_a9 == file_root.m_number._M_elems[7]._3_1_);
          auVar18[0] = -((char)hashes.
                               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                               ._M_impl.super__Vector_impl_data._M_start ==
                        (char)file_root.m_number._M_elems[0]);
          auVar18[1] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_1_ ==
                        file_root.m_number._M_elems[0]._1_1_);
          auVar18[2] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._2_1_ ==
                        file_root.m_number._M_elems[0]._2_1_);
          auVar18[3] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._3_1_ ==
                        file_root.m_number._M_elems[0]._3_1_);
          auVar18[4] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_1_ ==
                        (char)file_root.m_number._M_elems[1]);
          auVar18[5] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._5_1_ ==
                        file_root.m_number._M_elems[1]._1_1_);
          auVar18[6] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._6_1_ ==
                        file_root.m_number._M_elems[1]._2_1_);
          auVar18[7] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._7_1_ ==
                        file_root.m_number._M_elems[1]._3_1_);
          auVar18[8] = -((char)hashes.
                               super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish ==
                        (char)file_root.m_number._M_elems[2]);
          auVar18[9] = -(hashes.
                         super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish._1_1_ ==
                        file_root.m_number._M_elems[2]._1_1_);
          auVar18[10] = -(hashes.
                          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish._2_1_ ==
                         file_root.m_number._M_elems[2]._2_1_);
          auVar18[0xb] = -(hashes.
                           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._3_1_ ==
                          file_root.m_number._M_elems[2]._3_1_);
          auVar18[0xc] = -(hashes.
                           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_1_ ==
                          (char)file_root.m_number._M_elems[3]);
          auVar18[0xd] = -(hashes.
                           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._5_1_ ==
                          file_root.m_number._M_elems[3]._1_1_);
          auVar18[0xe] = -(hashes.
                           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._6_1_ ==
                          file_root.m_number._M_elems[3]._2_1_);
          auVar18[0xf] = -(hashes.
                           super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._7_1_ ==
                          file_root.m_number._M_elems[3]._3_1_);
          auVar18 = auVar18 & auVar17;
          bVar16 = (ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                           (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) == 0xffff;
          if (bVar16) {
            uVar12 = (ulong)iVar8 & 0xffffffff;
          }
          hr.file.m_val = (int)uVar12;
        } while ((!bVar16) &&
                (iVar8._end.m_val = 0, iVar8._begin.m_val = index.m_val + 1,
                sVar13.m_val + -1 != index.m_val));
      }
      pcVar9 = ptr + 0x21;
      hr.base = 0;
      iVar5 = 4;
      do {
        hr.base = (uint)(byte)pcVar9[-1] | hr.base << 8;
        pcVar9 = pcVar9 + 1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      hr.index = 0;
      iVar5 = 4;
      do {
        hr.index = (uint)(byte)pcVar9[-1] | hr.index << 8;
        pcVar9 = pcVar9 + 1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      blocks = 0;
      iVar5 = 4;
      do {
        blocks = (uint)(byte)pcVar9[-1] | blocks << 8;
        pcVar9 = pcVar9 + 1;
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
      uVar14 = 0;
      iVar5 = 4;
      do {
        ptr = pcVar9;
        uVar14 = (uint)(byte)ptr[-1] | uVar14 << 8;
        iVar5 = iVar5 + -1;
        pcVar9 = ptr + 1;
      } while (iVar5 != 0);
      hr.count = blocks;
      hr.proof_layers = uVar14;
      bVar16 = validate_hash_request
                         (&hr,&((this_02->super_torrent_hot_members).m_torrent_file.
                                super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->m_files);
      this_03 = local_d0;
      if (bVar16) {
        iVar5 = merkle_num_leafs(blocks);
        iVar5 = merkle_num_layers(iVar5);
        iVar6 = crypto_receive_buffer::packet_size(this_00);
        iVar15 = (uVar14 - iVar5) + 1;
        iVar5 = 0;
        if (0 < iVar15) {
          iVar5 = iVar15;
        }
        if (iVar6 == (iVar5 + blocks) * 0x20 + 0x31) {
          bVar16 = crypto_receive_buffer::packet_finished(this_00);
          if (bVar16) {
            _Var10 = ::std::
                     __remove_if<__gnu_cxx::__normal_iterator<libtorrent::aux::hash_request*,std::vector<libtorrent::aux::hash_request,std::allocator<libtorrent::aux::hash_request>>>,__gnu_cxx::__ops::_Iter_equals_val<libtorrent::aux::hash_request_const>>
                               ((this->m_hash_requests).
                                super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (this->m_hash_requests).
                                super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                                ._M_impl.super__Vector_impl_data._M_finish,&hr);
            phVar3 = (this->m_hash_requests).
                     super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            if ((_Var10._M_current != phVar3) &&
               (phVar4 = (this->m_hash_requests).
                         super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
                         ._M_impl.super__Vector_impl_data._M_finish,
               phVar11 = (pointer)((long)_Var10._M_current + ((long)phVar4 - (long)phVar3)),
               phVar4 != phVar11)) {
              (this->m_hash_requests).
              super__Vector_base<libtorrent::aux::hash_request,_std::allocator<libtorrent::aux::hash_request>_>
              ._M_impl.super__Vector_impl_data._M_finish = phVar11;
            }
            hashes.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            hashes.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            hashes.
            super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            if (ptr != pcVar7 + sVar19.m_len) {
              do {
                ::std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>
                ::emplace_back<char_const*&>
                          ((vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>
                            *)&hashes,&ptr);
                ptr = ptr + 0x20;
              } while (ptr != pcVar7 + sVar19.m_len);
            }
            bVar16 = peer_connection::should_log(&this->super_peer_connection,incoming_message);
            if (bVar16) {
              peer_connection::peer_log
                        (&this->super_peer_connection,incoming_message,"HASHES",
                         "file: %d base: %d idx: %d cnt: %d proofs: %d",(ulong)(uint)hr.file.m_val,
                         (ulong)(uint)hr.base,(ulong)(uint)hr.index,(ulong)(uint)hr.count,
                         (ulong)(uint)hr.proof_layers);
            }
            hashes_00.m_len =
                 (long)hashes.
                       super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)hashes.
                       super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
            hashes_00.m_ptr =
                 hashes.
                 super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            bVar16 = torrent::add_hashes(this_02,&hr,hashes_00);
            if (bVar16) {
              maybe_send_hash_request(this);
            }
            else {
              local_40 = errors::make_error_code(invalid_hashes);
              (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                        (this,&local_40,1,2);
            }
            if (hashes.
                super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(hashes.
                              super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)hashes.
                                    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)hashes.
                                    super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
        }
        else {
          hashes.
          super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
          ._M_impl.super__Vector_impl_data._0_16_ = errors::make_error_code(invalid_hashes);
          (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                    (this,&hashes,1,2);
        }
      }
      else {
        hashes.
        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
        ._M_impl.super__Vector_impl_data._0_16_ = errors::make_error_code(invalid_hashes);
        (*(this->super_peer_connection).super_bandwidth_socket._vptr_bandwidth_socket[0x14])
                  (this,&hashes,1,2);
      }
    }
    if (this_03 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_03);
    }
  }
  return;
}

Assistant:

void bt_peer_connection::on_hashes(int received)
	{
		INVARIANT_CHECK;

		TORRENT_ASSERT(received >= 0);
		received_bytes(0, received);

		if (!peer_info_struct()->protocol_v2)
		{
			disconnect(errors::invalid_message, operation_t::bittorrent, peer_error);
			return;
		}

		auto t = associated_torrent().lock();
		TORRENT_ASSERT(t);

		auto const& files = t->torrent_file().files();

		span<char const> recv_buffer = m_recv_buffer.get();

		int const header_size = 1 + 32 + 4 + 4 + 4 + 4;

		if (recv_buffer.size() < header_size)
		{
			return;
		}

		const char* ptr = recv_buffer.begin() + 1;

		auto const file_root = sha256_hash(ptr);
		file_index_t file_index{ -1 };
		for (file_index_t i : files.file_range())
		{
			if (files.root(i) == file_root)
			{
				file_index = i;
				break;
			}
		}
		ptr += sha256_hash::size();
		int const base = aux::read_int32(ptr);
		int const index = aux::read_int32(ptr);
		int const count = aux::read_int32(ptr);
		int const proof_layers = aux::read_int32(ptr);

		hash_request const hr(file_index, base, index, count, proof_layers);

		if (!validate_hash_request(hr, t->torrent_file().files()))
		{
			disconnect(errors::invalid_hashes, operation_t::bittorrent, peer_connection_interface::peer_error);
			return;
		}

		// subtract one because the the base layer doesn't count
		int const proof_hashes = std::max(0
			, proof_layers - (merkle_num_layers(merkle_num_leafs(count)) - 1));

		if (m_recv_buffer.packet_size() != header_size
			+ (count + proof_hashes) * int(sha256_hash::size()))
		{
			disconnect(errors::invalid_hashes, operation_t::bittorrent, peer_connection_interface::peer_error);
			return;
		}

		if (!m_recv_buffer.packet_finished()) return;

		auto new_end = std::remove(m_hash_requests.begin(), m_hash_requests.end(), hr);
		m_hash_requests.erase(new_end, m_hash_requests.end());

		std::vector<sha256_hash> hashes;
		while (ptr != recv_buffer.end())
		{
			hashes.emplace_back(ptr);
			ptr += sha256_hash::size();
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log(peer_log_alert::incoming_message))
		{
			peer_log(peer_log_alert::incoming_message, "HASHES"
				, "file: %d base: %d idx: %d cnt: %d proofs: %d"
				, static_cast<int>(hr.file), hr.base, hr.index, hr.count, hr.proof_layers);
		}
#endif

		if (!t->add_hashes(hr, hashes))
		{
			disconnect(errors::invalid_hashes, operation_t::bittorrent, peer_connection_interface::peer_error);
			return;
		}

		maybe_send_hash_request();
	}